

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index_storage_info.hpp
# Opt level: O2

void __thiscall
duckdb::IndexStorageInfo::IndexStorageInfo(IndexStorageInfo *this,IndexStorageInfo *param_1)

{
  uint32_t uVar1;
  uint32_t uVar2;
  
  ::std::__cxx11::string::string((string *)this,(string *)param_1);
  this->root = param_1->root;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable(&(this->options)._M_h,&(param_1->options)._M_h);
  ::std::vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>::
  vector(&(this->allocator_infos).
          super_vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
         ,&(param_1->allocator_infos).
           super_vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
        );
  ::std::
  vector<duckdb::vector<duckdb::IndexBufferInfo,_true>,_std::allocator<duckdb::vector<duckdb::IndexBufferInfo,_true>_>_>
  ::vector(&(this->buffers).
            super_vector<duckdb::vector<duckdb::IndexBufferInfo,_true>,_std::allocator<duckdb::vector<duckdb::IndexBufferInfo,_true>_>_>
           ,&(param_1->buffers).
             super_vector<duckdb::vector<duckdb::IndexBufferInfo,_true>,_std::allocator<duckdb::vector<duckdb::IndexBufferInfo,_true>_>_>
          );
  uVar1 = (param_1->root_block_ptr).offset;
  uVar2 = (param_1->root_block_ptr).unused_padding;
  (this->root_block_ptr).block_id = (param_1->root_block_ptr).block_id;
  (this->root_block_ptr).offset = uVar1;
  (this->root_block_ptr).unused_padding = uVar2;
  return;
}

Assistant:

IndexStorageInfo() {}